

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

void IoTHubClientCore_LL_DoWork(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)

{
  IOTHUB_CLIENT_CORE_LL_HANDLE pIVar1;
  IOTHUB_CLIENT_CORE_LL_HANDLE Entry;
  DLIST_ENTRY_TAG *pDVar2;
  int iVar3;
  IOTHUB_PROCESS_ITEM_RESULT IVar4;
  LOGGER_LOG p_Var5;
  DLIST_ENTRY_TAG *pDVar6;
  tickcounter_ms_t nowTick;
  IOTHUB_IDENTITY_INFO local_40;
  PDLIST_ENTRY local_38;
  
  if (iotHubClientHandle != (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    iVar3 = tickcounter_get_current_ms
                      (iotHubClientHandle->tickCounter,(tickcounter_ms_t *)&local_40);
    if (iVar3 == 0) {
      Entry = (IOTHUB_CLIENT_CORE_LL_HANDLE)(iotHubClientHandle->waitingToSend).Flink;
      while (Entry != iotHubClientHandle) {
        pDVar6 = (Entry->iot_msg_queue).Flink;
        if ((pDVar6 == (DLIST_ENTRY_TAG *)0x0) ||
           ((DLIST_ENTRY_TAG *)((long)local_40.device_twin - (long)pDVar6) <=
            (Entry->iot_msg_queue).Blink)) {
          Entry = (IOTHUB_CLIENT_CORE_LL_HANDLE)(Entry->waitingToSend).Flink;
        }
        else {
          pIVar1 = (IOTHUB_CLIENT_CORE_LL_HANDLE)(Entry->waitingToSend).Flink;
          DList_RemoveEntryList(&Entry->waitingToSend);
          if (Entry[-1].event_callbacks != (SINGLYLINKEDLIST_HANDLE)0x0) {
            (*(code *)Entry[-1].event_callbacks)(2,Entry[-1].model_id);
          }
          IoTHubMessage_Destroy((IOTHUB_MESSAGE_HANDLE)Entry[-1].diagnostic_setting);
          free(&Entry[-1].diagnostic_setting);
          Entry = pIVar1;
        }
      }
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"DoTimeouts",0x82e,1,
                  "unable to get the current ms, timeouts will not be processed");
      }
    }
    pDVar6 = (iotHubClientHandle->iot_msg_queue).Flink;
    if (pDVar6 != &iotHubClientHandle->iot_msg_queue) {
      local_38 = &iotHubClientHandle->iot_ack_queue;
      do {
        pDVar2 = pDVar6->Flink;
        local_40 = (IOTHUB_IDENTITY_INFO)&pDVar6[-3].Blink;
        IVar4 = (*iotHubClientHandle->IoTHubTransport_ProcessItem)
                          (iotHubClientHandle->transportHandle,IOTHUB_TYPE_DEVICE_TWIN,&local_40);
        if ((IVar4 & ~IOTHUB_PROCESS_ERROR) == IOTHUB_PROCESS_NOT_CONNECTED) break;
        DList_RemoveEntryList(pDVar6);
        if (IVar4 == IOTHUB_PROCESS_OK) {
          DList_InsertTailList(local_38,pDVar6);
        }
        else {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_DoWork",0x867,1,"Failure queue processing item");
          }
          CONSTBUFFER_DecRef((CONSTBUFFER_HANDLE)pDVar6[-1].Flink);
          free(&pDVar6[-3].Blink);
        }
        pDVar6 = pDVar2;
      } while (pDVar2 != &iotHubClientHandle->iot_msg_queue);
    }
    (*iotHubClientHandle->IoTHubTransport_DoWork)(iotHubClientHandle->transportHandle);
  }
  return;
}

Assistant:

void IoTHubClientCore_LL_DoWork(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle)
{
    if (iotHubClientHandle != NULL)
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        DoTimeouts(handleData);

        DLIST_ENTRY* client_item = handleData->iot_msg_queue.Flink;
        while (client_item != &(handleData->iot_msg_queue)) /*while we are not at the end of the list*/
        {
            PDLIST_ENTRY next_item = client_item->Flink;

            IOTHUB_DEVICE_TWIN* queue_data = containingRecord(client_item, IOTHUB_DEVICE_TWIN, entry);
            IOTHUB_IDENTITY_INFO identity_info;
            identity_info.device_twin = queue_data;
            IOTHUB_PROCESS_ITEM_RESULT process_results =  handleData->IoTHubTransport_ProcessItem(handleData->transportHandle, IOTHUB_TYPE_DEVICE_TWIN, &identity_info);
            if (process_results == IOTHUB_PROCESS_CONTINUE || process_results == IOTHUB_PROCESS_NOT_CONNECTED)
            {
                break;
            }
            else
            {
                DList_RemoveEntryList(client_item);
                if (process_results == IOTHUB_PROCESS_OK)
                {
                    DList_InsertTailList(&(iotHubClientHandle->iot_ack_queue), &(queue_data->entry));
                }
                else
                {
                    LogError("Failure queue processing item");
                    device_twin_data_destroy(queue_data);
                }
            }
            // Move along to the next item
            client_item = next_item;
        }

        handleData->IoTHubTransport_DoWork(handleData->transportHandle);
    }
}